

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteString
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  bool bVar1;
  uint8_t *puVar2;
  string *psVar3;
  string *psVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  EpsCopyOutputStream *this;
  EpsCopyOutputStream *this_00;
  EpsCopyOutputStream *this_01;
  EpsCopyOutputStream *this_02;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  undefined1 auStack_d8 [24];
  string *psStack_c0;
  ulong uStack_b8;
  code *pcStack_b0;
  undefined1 auStack_a0 [24];
  string *psStack_88;
  ulong uStack_80;
  code *pcStack_78;
  undefined1 auStack_68 [16];
  CodedOutputStream *pCStack_58;
  string *psStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined1 local_30 [16];
  
  uVar9 = field_number << 3;
  pbVar11 = output->cur_;
  if ((output->impl_).end_ <= pbVar11) {
    pcStack_40 = (code *)0x33c5c2;
    pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar11);
  }
  uVar6 = field_number * 8 + 2;
  output->cur_ = pbVar11;
  uVar8 = uVar6;
  if (0x7f < uVar9) {
    do {
      *pbVar11 = (byte)uVar8 | 0x80;
      uVar6 = uVar8 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar8;
      uVar8 = uVar6;
    } while (bVar1);
  }
  *pbVar11 = (byte)uVar6;
  output->cur_ = pbVar11 + 1;
  if ((value->_M_string_length & 0xffffffff80000000) == 0) {
    psVar3 = (string *)0x0;
  }
  else {
    pcStack_40 = (code *)0x33c5d8;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (value->_M_string_length,0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (psVar3 == (string *)0x0) {
    uVar9 = (uint)value->_M_string_length;
    pbVar11 = output->cur_;
    if ((output->impl_).end_ <= pbVar11) {
      pcStack_40 = (code *)0x33c5e8;
      pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar11);
    }
    output->cur_ = pbVar11;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar11 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar1);
    }
    *pbVar11 = (byte)uVar9;
    pbVar11 = pbVar11 + 1;
    output->cur_ = pbVar11;
    data = (value->_M_dataplus)._M_p;
    uVar9 = (uint)value->_M_string_length;
    if ((long)(output->impl_).end_ - (long)pbVar11 < (long)(int)uVar9) {
      pcStack_40 = (code *)0x33c5fb;
      pbVar11 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,uVar9,pbVar11);
    }
    else {
      pcStack_40 = (code *)0x33c568;
      memcpy(pbVar11,data,(ulong)uVar9);
      pbVar11 = pbVar11 + (int)uVar9;
    }
    output->cur_ = pbVar11;
    return;
  }
  uVar8 = (uint)local_30;
  pcStack_40 = WriteStringMaybeAliased;
  WriteString();
  uVar6 = uVar8 << 3;
  pbVar11 = this[1].end_;
  pCStack_58 = output;
  psStack_50 = value;
  uStack_48 = (ulong)(uint)field_number;
  pcStack_40 = (code *)(ulong)uVar9;
  if (this->end_ <= pbVar11) {
    pcStack_78 = (code *)0x33c6fd;
    pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this,pbVar11);
  }
  uVar7 = uVar8 * 8 + 2;
  this[1].end_ = pbVar11;
  uVar9 = uVar7;
  if (0x7f < uVar6) {
    do {
      *pbVar11 = (byte)uVar9 | 0x80;
      uVar7 = uVar9 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar9;
      uVar9 = uVar7;
    } while (bVar1);
  }
  *pbVar11 = (byte)uVar7;
  this[1].end_ = pbVar11 + 1;
  if ((*(ulong *)(psVar3 + 8) & 0xffffffff80000000) == 0) {
    psVar4 = (string *)0x0;
  }
  else {
    pcStack_78 = (code *)0x33c713;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (*(ulong *)(psVar3 + 8),0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (psVar4 == (string *)0x0) {
    uVar9 = *(uint *)(psVar3 + 8);
    pbVar11 = this[1].end_;
    if (this->end_ <= pbVar11) {
      pcStack_78 = (code *)0x33c723;
      pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this,pbVar11);
    }
    this[1].end_ = pbVar11;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar11 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar1);
    }
    *pbVar11 = (byte)uVar9;
    this[1].end_ = pbVar11 + 1;
    pcStack_78 = (code *)0x33c6a7;
    puVar2 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                       (this,*(void **)psVar3,*(int *)(psVar3 + 8),pbVar11 + 1);
    this[1].end_ = puVar2;
    return;
  }
  uVar9 = (uint)auStack_68;
  pcStack_78 = WriteBytes;
  WriteStringMaybeAliased();
  uVar7 = uVar9 << 3;
  pbVar11 = this_00[1].end_;
  psStack_88 = psVar3;
  uStack_80 = (ulong)uVar8;
  pcStack_78 = (code *)(ulong)uVar6;
  if (this_00->end_ <= pbVar11) {
    pcStack_b0 = (code *)0x33c840;
    pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_00,pbVar11);
  }
  uVar6 = uVar9 * 8 + 2;
  this_00[1].end_ = pbVar11;
  uVar8 = uVar6;
  if (0x7f < uVar7) {
    do {
      *pbVar11 = (byte)uVar8 | 0x80;
      uVar6 = uVar8 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar8;
      uVar8 = uVar6;
    } while (bVar1);
  }
  *pbVar11 = (byte)uVar6;
  this_00[1].end_ = pbVar11 + 1;
  if ((*(ulong *)(psVar4 + 8) & 0xffffffff80000000) == 0) {
    psVar3 = (string *)0x0;
  }
  else {
    pcStack_b0 = (code *)0x33c856;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (*(ulong *)(psVar4 + 8),0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (psVar3 == (string *)0x0) {
    uVar9 = *(uint *)(psVar4 + 8);
    pbVar11 = this_00[1].end_;
    if (this_00->end_ <= pbVar11) {
      pcStack_b0 = (code *)0x33c866;
      pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_00,pbVar11);
    }
    this_00[1].end_ = pbVar11;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar11 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar1);
    }
    *pbVar11 = (byte)uVar9;
    pbVar11 = pbVar11 + 1;
    this_00[1].end_ = pbVar11;
    uVar9 = *(uint *)(psVar4 + 8);
    if ((long)this_00->end_ - (long)pbVar11 < (long)(int)uVar9) {
      pcStack_b0 = (code *)0x33c879;
      pbVar11 = io::EpsCopyOutputStream::WriteRawFallback(this_00,*(void **)psVar4,uVar9,pbVar11);
    }
    else {
      pcStack_b0 = (code *)0x33c7e6;
      memcpy(pbVar11,*(void **)psVar4,(ulong)uVar9);
      pbVar11 = pbVar11 + (int)uVar9;
    }
    this_00[1].end_ = pbVar11;
    return;
  }
  iVar10 = (int)auStack_a0;
  pcStack_b0 = WriteBytesMaybeAliased;
  WriteBytes();
  pbVar11 = this_01[1].end_;
  psStack_c0 = psVar4;
  uStack_b8 = (ulong)uVar9;
  pcStack_b0 = (code *)(ulong)uVar7;
  if (this_01->end_ <= pbVar11) {
    pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_01,pbVar11);
  }
  uVar8 = iVar10 * 8 + 2;
  this_01[1].end_ = pbVar11;
  uVar9 = uVar8;
  if (0x7f < (uint)(iVar10 << 3)) {
    do {
      *pbVar11 = (byte)uVar9 | 0x80;
      uVar8 = uVar9 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar9;
      uVar9 = uVar8;
    } while (bVar1);
  }
  *pbVar11 = (byte)uVar8;
  this_01[1].end_ = pbVar11 + 1;
  if ((*(ulong *)(psVar3 + 8) & 0xffffffff80000000) == 0) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (*(ulong *)(psVar3 + 8),0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (psVar4 != (string *)0x0) {
    iVar10 = (int)auStack_d8;
    WriteBytesMaybeAliased();
    uVar9 = iVar10 << 3;
    pbVar11 = this_02[1].end_;
    if (this_02->end_ <= pbVar11) {
      pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_02,pbVar11);
    }
    uVar5 = (ulong)(iVar10 * 8 + 3);
    this_02[1].end_ = pbVar11;
    if (0x7f < uVar9) {
      do {
        uVar8 = (uint)uVar5;
        *pbVar11 = (byte)uVar5 | 0x80;
        uVar5 = uVar5 >> 7;
        pbVar11 = pbVar11 + 1;
      } while (0x3fff < uVar8);
    }
    *pbVar11 = (byte)uVar5;
    this_02[1].end_ = pbVar11 + 1;
    pbVar11 = (byte *)(**(code **)(*(long *)psVar4 + 0x28))(psVar4,pbVar11 + 1,this_02);
    this_02[1].end_ = pbVar11;
    if (this_02->end_ <= pbVar11) {
      pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_02,pbVar11);
    }
    uVar6 = uVar9 | 4;
    this_02[1].end_ = pbVar11;
    uVar8 = uVar6;
    if (0x7f < uVar9) {
      do {
        *pbVar11 = (byte)uVar8 | 0x80;
        uVar6 = uVar8 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar6;
      } while (bVar1);
    }
    *pbVar11 = (byte)uVar6;
    this_02[1].end_ = pbVar11 + 1;
    return;
  }
  uVar9 = *(uint *)(psVar3 + 8);
  pbVar11 = this_01[1].end_;
  if (this_01->end_ <= pbVar11) {
    pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_01,pbVar11);
  }
  this_01[1].end_ = pbVar11;
  uVar8 = uVar9;
  if (0x7f < uVar9) {
    do {
      *pbVar11 = (byte)uVar8 | 0x80;
      uVar9 = uVar8 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar8;
      uVar8 = uVar9;
    } while (bVar1);
  }
  *pbVar11 = (byte)uVar9;
  this_01[1].end_ = pbVar11 + 1;
  puVar2 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (this_01,*(void **)psVar3,*(int *)(psVar3 + 8),pbVar11 + 1);
  this_01[1].end_ = puVar2;
  return;
}

Assistant:

void WireFormatLite::WriteString(int field_number, const std::string& value,
                                 io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}